

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::QueryProfiler(QueryProfiler *this,ClientContext *context_p)

{
  this->context = context_p;
  this->running = false;
  (this->root).super_unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
  _M_t.super___uniq_ptr_impl<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::ProfilingNode_*,_std::default_delete<duckdb::ProfilingNode>_>.
  super__Head_base<0UL,_duckdb::ProfilingNode_*,_false>._M_head_impl = (ProfilingNode *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  QueryInfo::QueryInfo(&this->query_info);
  (this->main_query).start.__d.__r = 0;
  (this->main_query).end.__d.__r = 0;
  (this->main_query).finished = false;
  (this->tree_map)._M_h._M_buckets = &(this->tree_map)._M_h._M_single_bucket;
  (this->tree_map)._M_h._M_bucket_count = 1;
  (this->tree_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tree_map)._M_h._M_element_count = 0;
  (this->tree_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phase_profiler).start.__d.__r = 0;
  (this->phase_profiler).end.__d.__r = 0;
  (this->phase_profiler).finished = false;
  (this->tree_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tree_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_explain_analyze = false;
  (this->phase_timings)._M_h._M_buckets = &(this->phase_timings)._M_h._M_single_bucket;
  (this->phase_timings)._M_h._M_bucket_count = 1;
  (this->phase_timings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phase_timings)._M_h._M_element_count = 0;
  (this->phase_timings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phase_timings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phase_timings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
  super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
  super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->phase_stack).super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>.
  super__Vector_base<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

QueryProfiler::QueryProfiler(ClientContext &context_p)
    : context(context_p), running(false), query_requires_profiling(false), is_explain_analyze(false) {
}